

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O0

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  unsigned_short uVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  long in_RSI;
  long in_RDI;
  float fVar5;
  int i_1;
  float *outptr_1;
  unsigned_short *ptr_1;
  int q_1;
  int i;
  unsigned_short *outptr;
  float *ptr;
  int q;
  int size;
  size_t out_elemsize;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffe20;
  Mat *in_stack_fffffffffffffe28;
  int _elempack;
  size_t in_stack_fffffffffffffe30;
  Mat *pMVar6;
  undefined8 in_stack_fffffffffffffe38;
  int _w;
  Mat *in_stack_fffffffffffffe40;
  Allocator *in_stack_fffffffffffffe50;
  int local_194;
  Mat local_190;
  Mat *local_150;
  Mat local_148;
  unsigned_short *local_108;
  int local_100;
  int local_fc;
  Mat local_f8;
  unsigned_short *local_b8;
  Mat local_a0;
  float *local_60;
  int local_58;
  int local_54;
  long local_50;
  int local_44;
  long local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  if (*(int *)(in_RDI + 0x80) == *(int *)(in_RDI + 0x84)) {
    Mat::operator=(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    local_4 = 0;
  }
  else {
    local_2c = *(int *)(in_RSI + 0x2c);
    local_30 = *(int *)(in_RSI + 0x30);
    local_34 = *(int *)(in_RSI + 0x34);
    local_38 = *(int *)(in_RSI + 0x28);
    local_40 = *(long *)(in_RSI + 0x10);
    local_44 = *(int *)(in_RSI + 0x18);
    if (*(int *)(in_RDI + 0x84) == 1) {
      local_50 = (long)(local_44 << 2);
    }
    else if (*(int *)(in_RDI + 0x84) == 2) {
      local_50 = (long)(local_44 << 1);
    }
    else {
      local_50 = local_40;
      if (*(int *)(in_RDI + 0x84) == 3) {
        local_50 = (long)local_44;
      }
    }
    _elempack = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    _w = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    if (local_38 == 1) {
      Mat::create(in_stack_fffffffffffffe40,_w,in_stack_fffffffffffffe30,_elempack,
                  (Allocator *)in_stack_fffffffffffffe20);
    }
    else if (local_38 == 2) {
      Mat::create(in_stack_fffffffffffffe40,_w,(int)in_stack_fffffffffffffe38,
                  in_stack_fffffffffffffe30,_elempack,(Allocator *)in_stack_fffffffffffffe20);
    }
    else if (local_38 == 3) {
      Mat::create(in_stack_fffffffffffffe40,_w,(int)in_stack_fffffffffffffe38,
                  (int)(in_stack_fffffffffffffe30 >> 0x20),(size_t)in_stack_fffffffffffffe28,
                  (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),in_stack_fffffffffffffe50);
    }
    bVar1 = Mat::empty(in_stack_fffffffffffffe20);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_54 = local_2c * local_30 * local_44;
      if ((*(int *)(in_RDI + 0x80) == 1) && (*(int *)(in_RDI + 0x84) == 2)) {
        for (local_58 = 0; local_58 < local_34; local_58 = local_58 + 1) {
          pMVar6 = &local_a0;
          Mat::channel(in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
          pfVar3 = Mat::operator_cast_to_float_(pMVar6);
          Mat::~Mat((Mat *)0x1a81f2);
          pMVar6 = &local_f8;
          local_60 = pfVar3;
          Mat::channel(in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
          puVar4 = Mat::operator_cast_to_unsigned_short_(pMVar6);
          Mat::~Mat((Mat *)0x1a823e);
          local_b8 = puVar4;
          for (local_fc = 0; local_fc < local_54; local_fc = local_fc + 1) {
            uVar2 = float32_to_float16(local_60[local_fc]);
            local_b8[local_fc] = uVar2;
          }
        }
      }
      if ((*(int *)(in_RDI + 0x80) == 2) && (*(int *)(in_RDI + 0x84) == 1)) {
        for (local_100 = 0; local_100 < local_34; local_100 = local_100 + 1) {
          pMVar6 = &local_148;
          Mat::channel(in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
          puVar4 = Mat::operator_cast_to_unsigned_short_(pMVar6);
          Mat::~Mat((Mat *)0x1a8396);
          in_stack_fffffffffffffe20 = &local_190;
          local_108 = puVar4;
          Mat::channel(in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
          in_stack_fffffffffffffe28 = (Mat *)Mat::operator_cast_to_float_(in_stack_fffffffffffffe20)
          ;
          Mat::~Mat((Mat *)0x1a83dc);
          local_150 = in_stack_fffffffffffffe28;
          for (local_194 = 0; local_194 < local_54; local_194 = local_194 + 1) {
            fVar5 = float16_to_float32(local_108[local_194]);
            *(float *)((long)&local_150->data + (long)local_194 * 4) = fVar5;
          }
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * elempack;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}